

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O3

ssize_t __thiscall
CVmMemorySourceList::read(CVmMemorySourceList *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  
  uVar2 = 1;
  if ((long)__buf + this->cur_block_ofs_ + this->cur_block_->ofs <= this->len_) {
    iVar1 = readc(this,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
    uVar2 = (ulong)((void *)(long)iVar1 != __buf);
  }
  return uVar2;
}

Assistant:

int read(void *buf, size_t len)
    {
        /* 
         *   if the request would take us past the current content length,
         *   fail immediately, since we know we can't satisfy the request 
         */
        if (cur_block_->ofs + cur_block_ofs_ + (long)len > len_)
            return 1;

        /* 
         *   do the read; return success == 0 if the amount read exactly
         *   matches the requested length 
         */
        return (size_t)readc(buf, len) != len;
    }